

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::GetPropertyReferenceQuery
          (CustomExternalWrapperObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  anon_class_56_7_bef9b04b fn_00;
  anon_class_16_2_4c80b24b getPropertyName_00;
  IRecyclerVisitedObject IVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  PropertyDescriptor local_138;
  CustomExternalWrapperObject *local_108;
  CustomExternalWrapperObject *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  PropertyDescriptor *local_c8;
  BOOL local_bc;
  CustomExternalWrapperObject *pCStack_b8;
  BOOL foundProperty;
  anon_class_16_2_4c80b24b getPropertyName;
  anon_class_56_7_bef9b04b fn;
  PropertyDescriptor result;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  undefined1 auStack_20 [4];
  PropertyId propertyId_local;
  Var originalInstance_local;
  CustomExternalWrapperObject *this_local;
  
  result._40_8_ = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  _auStack_20 = (_func_int **)originalInstance;
  originalInstance_local = this;
  BVar2 = VerifyObjectAlive(this);
  if (BVar2 == 0) {
    this_local._4_4_ = Property_NotFound;
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&fn.result);
    IVar1._vptr_IRecyclerVisitedObject = _auStack_20;
    fn.this = (CustomExternalWrapperObject *)auStack_20;
    fn.originalInstance = (Var *)((long)&value_local + 4);
    fn.propertyId = (PropertyId *)&info_local;
    fn.value = (Var **)&requestContext_local;
    fn.info = (PropertyValueInfo **)&result.Configurable;
    fn.requestContext = (ScriptContext **)&fn.result;
    getPropertyName.this = (CustomExternalWrapperObject *)((long)&value_local + 4);
    pCStack_b8 = this;
    getPropertyName.propertyId = (PropertyId *)this;
    memcpy(&local_f8,&getPropertyName.propertyId,0x38);
    local_108 = pCStack_b8;
    local_100 = getPropertyName.this;
    getPropertyName_00.propertyId = (PropertyId *)getPropertyName.this;
    getPropertyName_00.this = pCStack_b8;
    fn_00.originalInstance = (Var *)uStack_f0;
    fn_00.this = (CustomExternalWrapperObject *)local_f8;
    fn_00.propertyId = (PropertyId *)local_e8;
    fn_00.value = (Var **)uStack_e0;
    fn_00.info = (PropertyValueInfo **)local_d8;
    fn_00.requestContext = (ScriptContext **)uStack_d0;
    fn_00.result = local_c8;
    local_bc = GetPropertyTrap<Js::CustomExternalWrapperObject::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__0,Js::CustomExternalWrapperObject::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__1>
                         (this,IVar1._vptr_IRecyclerVisitedObject,(PropertyDescriptor *)&fn.result,
                          fn_00,getPropertyName_00,(ScriptContext *)result._40_8_,
                          (PropertyValueInfo *)requestContext_local);
    IVar1._vptr_IRecyclerVisitedObject = _auStack_20;
    if (local_bc == 0) {
      pRVar3 = ScriptContext::GetMissingPropertyResult((ScriptContext *)result._40_8_);
      info_local->m_instance = pRVar3;
    }
    else {
      PropertyDescriptor::PropertyDescriptor(&local_138,(PropertyDescriptor *)&fn.result);
      pRVar3 = (RecyclableObject *)
               GetValueFromDescriptor
                         (this,IVar1._vptr_IRecyclerVisitedObject,&local_138,
                          (ScriptContext *)result._40_8_);
      info_local->m_instance = pRVar3;
    }
    this_local._4_4_ = JavascriptConversion::BooleanToPropertyQueryFlags(local_bc);
  }
  return this_local._4_4_;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::GetPropertyReferenceQuery(Js::Var originalInstance, Js::PropertyId propertyId, Js::Var* value, Js::PropertyValueInfo* info, Js::ScriptContext* requestContext)
{
    if (!this->VerifyObjectAlive()) return Js::PropertyQueryFlags::Property_NotFound;
    Js::PropertyDescriptor result;

    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        BOOL found = JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyReferenceQuery(originalInstance, propertyId, value, info, requestContext));
        result.SetValue(*value);
        return found;
    };

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };

    BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyName, requestContext, info);
    if (!foundProperty)
    {
        *value = requestContext->GetMissingPropertyResult();
    }
    else
    {
        *value = GetValueFromDescriptor(originalInstance, result, requestContext);
    }
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
}